

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# univalue.cpp
# Opt level: O0

void __thiscall UniValue::setBool(UniValue *this,bool val_)

{
  long lVar1;
  byte bVar2;
  byte in_SIL;
  char *in_RDI;
  long in_FS_OFFSET;
  UniValue *in_stack_ffffffffffffffd8;
  undefined7 in_stack_ffffffffffffffe8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = in_SIL & 1;
  clear(in_stack_ffffffffffffffd8);
  in_RDI[0] = '\x05';
  in_RDI[1] = '\0';
  in_RDI[2] = '\0';
  in_RDI[3] = '\0';
  if ((bVar2 & 1) != 0) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(bVar2,in_stack_ffffffffffffffe8),in_RDI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void UniValue::setBool(bool val_)
{
    clear();
    typ = VBOOL;
    if (val_)
        val = "1";
}